

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

ActivationSoftplus * __thiscall
CoreML::Specification::ActivationSoftplus::New(ActivationSoftplus *this,Arena *arena)

{
  ActivationSoftplus *this_00;
  
  this_00 = (ActivationSoftplus *)operator_new(0x18);
  ActivationSoftplus(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ActivationSoftplus>(arena,this_00);
  }
  return this_00;
}

Assistant:

ActivationSoftplus* ActivationSoftplus::New(::google::protobuf::Arena* arena) const {
  ActivationSoftplus* n = new ActivationSoftplus;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}